

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O0

bool __thiscall Minisat::SimpSolver::asymm(SimpSolver *this,Var v,CRef cr)

{
  bool bVar1;
  int iVar2;
  uint32_t uVar3;
  int iVar4;
  Lit p;
  CRef CVar5;
  Lit *pLVar6;
  bool local_65;
  lbool local_39;
  int local_38;
  int local_34;
  Lit local_30;
  int i;
  Lit l;
  Clause *c;
  CRef cr_local;
  Var v_local;
  SimpSolver *this_local;
  
  _l = ClauseAllocator::operator[](&(this->super_Solver).ca,cr);
  iVar2 = Solver::decisionLevel(&this->super_Solver);
  if (iVar2 != 0) {
    __assert_fail("decisionLevel() == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/luciferxiaozhi[P]VertexCover_CNFSAT_/minisat/minisat/simp/SimpSolver.cc"
                  ,0x19b,"bool Minisat::SimpSolver::asymm(Var, CRef)");
  }
  uVar3 = Clause::mark(_l);
  if ((uVar3 == 0) && (bVar1 = Solver::satisfied(&this->super_Solver,_l), !bVar1)) {
    i = vec<Minisat::Lit,_int>::size(&(this->super_Solver).trail);
    vec<int,_int>::push(&(this->super_Solver).trail_lim,&i);
    local_30.x = -2;
    for (local_34 = 0; iVar2 = local_34, iVar4 = Clause::size(_l), iVar2 < iVar4;
        local_34 = local_34 + 1) {
      pLVar6 = Clause::operator[](_l,local_34);
      local_38 = pLVar6->x;
      iVar2 = var((Lit)local_38);
      local_65 = false;
      if (iVar2 != v) {
        pLVar6 = Clause::operator[](_l,local_34);
        local_39 = Solver::value(&this->super_Solver,(Lit)pLVar6->x);
        local_65 = lbool::operator!=(&local_39,l_False);
      }
      if (local_65 == false) {
        pLVar6 = Clause::operator[](_l,local_34);
        local_30.x = pLVar6->x;
      }
      else {
        pLVar6 = Clause::operator[](_l,local_34);
        p = operator~(pLVar6->x);
        Solver::uncheckedEnqueue(&this->super_Solver,p,0xffffffff);
      }
    }
    CVar5 = Solver::propagate(&this->super_Solver);
    if (CVar5 == 0xffffffff) {
      Solver::cancelUntil(&this->super_Solver,0);
    }
    else {
      Solver::cancelUntil(&this->super_Solver,0);
      this->asymm_lits = this->asymm_lits + 1;
      bVar1 = strengthenClause(this,cr,local_30);
      if (!bVar1) {
        return false;
      }
    }
  }
  return true;
}

Assistant:

bool SimpSolver::asymm(Var v, CRef cr)
{
    Clause& c = ca[cr];
    assert(decisionLevel() == 0);

    if (c.mark() || satisfied(c)) return true;

    trail_lim.push(trail.size());
    Lit l = lit_Undef;
    for (int i = 0; i < c.size(); i++)
        if (var(c[i]) != v && value(c[i]) != l_False)
            uncheckedEnqueue(~c[i]);
        else
            l = c[i];

    if (propagate() != CRef_Undef){
        cancelUntil(0);
        asymm_lits++;
        if (!strengthenClause(cr, l))
            return false;
    }else
        cancelUntil(0);

    return true;
}